

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O3

QSet<QSpanCollection::Span_*> __thiscall
QSpanCollection::spansInRect(QSpanCollection *this,int x,int y,int w,int h)

{
  _Rb_tree_color _Var1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_node_base *p_Var5;
  int iVar6;
  _Base_ptr p_Var7;
  undefined4 in_register_00000034;
  int in_R9D;
  int iVar8;
  long in_FS_OFFSET;
  bool bVar9;
  long local_58;
  QHashDummyValue local_41;
  _Base_ptr local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->spans).super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  local_58 = *(long *)(CONCAT44(in_register_00000034,x) + 0x18);
  if (local_58 == 0) {
    p_Var3 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var4 = *(_Rb_tree_node_base **)(local_58 + 0x18);
    p_Var3 = (_Rb_tree_node_base *)(local_58 + 0x10);
    if (p_Var4 != (_Rb_tree_node_base *)0x0) {
      do {
        _Var1 = p_Var4[1]._M_color;
        bVar9 = (int)(_Var1 + w) < 0;
        if (SBORROW4(_Var1,-w) == bVar9) {
          p_Var3 = p_Var4;
        }
        p_Var4 = (&p_Var4->_M_left)[SBORROW4(_Var1,-w) != bVar9];
      } while (p_Var4 != (_Base_ptr)0x0);
    }
  }
  p_Var4 = (_Rb_tree_node_base *)(local_58 + 0x10);
  if (local_58 == 0) {
    p_Var4 = (_Rb_tree_node_base *)0x0;
  }
  if (p_Var3 == p_Var4) {
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var3);
  }
  iVar6 = in_R9D + w;
  if (SBORROW4(iVar6,-p_Var3[1]._M_color) == (int)(iVar6 + p_Var3[1]._M_color) < 0) {
    iVar8 = h + y;
    do {
      p_Var7 = p_Var3[1]._M_parent;
      if (p_Var7 == (_Base_ptr)0x0) {
        p_Var4 = (_Rb_tree_node_base *)0x0;
      }
      else {
        p_Var4 = (_Rb_tree_node_base *)&p_Var7->_M_left;
        for (p_Var5 = p_Var7->_M_right; p_Var5 != (_Rb_tree_node_base *)0x0;
            p_Var5 = (&p_Var5->_M_left)[SBORROW4(_Var1,-y) != bVar9]) {
          _Var1 = p_Var5[1]._M_color;
          bVar9 = (int)(_Var1 + y) < 0;
          if (SBORROW4(_Var1,-y) == bVar9) {
            p_Var4 = p_Var5;
          }
        }
      }
      p_Var5 = (_Rb_tree_node_base *)&p_Var7->_M_left;
      if (p_Var7 == (_Base_ptr)0x0) {
        p_Var5 = (_Rb_tree_node_base *)0x0;
      }
      if (p_Var4 == p_Var5) {
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var4);
      }
      if (SBORROW4(iVar8,-p_Var4[1]._M_color) == (int)(iVar8 + p_Var4[1]._M_color) < 0) {
        do {
          p_Var2 = p_Var4[1]._M_parent;
          if ((w <= *(int *)&p_Var2->_M_parent) && (y <= *(int *)((long)&p_Var2->_M_parent + 4))) {
            local_40 = p_Var2;
            QHash<QSpanCollection::Span*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                      ((QHash<QSpanCollection::Span*,QHashDummyValue> *)this,(Span **)&local_40,
                       &local_41);
            p_Var7 = p_Var3[1]._M_parent;
          }
          if (p_Var7 == (_Base_ptr)0x0) {
            p_Var5 = (_Rb_tree_node_base *)0x0;
          }
          else {
            p_Var5 = *(_Rb_tree_node_base **)(p_Var7 + 1);
          }
        } while ((p_Var4 != p_Var5) &&
                (p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var4),
                SBORROW4(iVar8,-p_Var4[1]._M_color) == (int)(iVar8 + p_Var4[1]._M_color) < 0));
        local_58 = *(long *)(CONCAT44(in_register_00000034,x) + 0x18);
      }
      if (local_58 == 0) {
        p_Var4 = (_Rb_tree_node_base *)0x0;
      }
      else {
        p_Var4 = *(_Rb_tree_node_base **)(local_58 + 0x20);
      }
    } while ((p_Var3 != p_Var4) &&
            (p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var3),
            SBORROW4(iVar6,-p_Var3[1]._M_color) == (int)(iVar6 + p_Var3[1]._M_color) < 0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QSet<QSpanCollection::Span_*>)(Hash)this;
}

Assistant:

QSet<QSpanCollection::Span *> QSpanCollection::spansInRect(int x, int y, int w, int h) const
{
    QSet<Span *> list;
    Index::const_iterator it_y = index.lowerBound(-y);
    if (it_y == index.end())
        --it_y;
    while(-it_y.key() <= y + h) {
        SubIndex::const_iterator it_x = (*it_y).lowerBound(-x);
        if (it_x == (*it_y).end())
            --it_x;
        while(-it_x.key() <= x + w) {
            Span *s = *it_x;
            if (s->bottom() >= y && s->right() >= x)
                list << s;
            if (it_x == (*it_y).begin())
                break;
            --it_x;
        }
        if (it_y == index.begin())
            break;
        --it_y;
    }
    return list;
}